

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

string * re2::DFA::DumpState_abi_cxx11_(State *state)

{
  long *in_RSI;
  string *in_RDI;
  int i;
  char *sep;
  string *s;
  string local_98 [32];
  string local_78 [36];
  int local_54;
  string local_50 [32];
  char *local_30;
  undefined1 local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  long *local_10;
  
  if (in_RSI == (long *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"_",&local_11);
    std::allocator<char>::~allocator((allocator<char> *)&local_11);
  }
  else if (in_RSI == (long *)0x1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"X",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
  }
  else if (in_RSI == (long *)0x2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"*",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
  }
  else {
    local_27 = 0;
    local_10 = in_RSI;
    std::__cxx11::string::string((string *)in_RDI);
    local_30 = anon_var_dwarf_290687 + 0x11;
    StringPrintf_abi_cxx11_((char *)local_50,"(%p)",local_10);
    std::__cxx11::string::operator+=((string *)in_RDI,local_50);
    std::__cxx11::string::~string(local_50);
    for (local_54 = 0; local_54 < (int)local_10[1]; local_54 = local_54 + 1) {
      if (*(int *)(*local_10 + (long)local_54 * 4) == -1) {
        std::__cxx11::string::operator+=((string *)in_RDI,"|");
        local_30 = anon_var_dwarf_290687 + 0x11;
      }
      else if (*(int *)(*local_10 + (long)local_54 * 4) == -2) {
        std::__cxx11::string::operator+=((string *)in_RDI,"||");
        local_30 = anon_var_dwarf_290687 + 0x11;
      }
      else {
        StringPrintf_abi_cxx11_
                  ((char *)local_78,"%s%d",local_30,(ulong)*(uint *)(*local_10 + (long)local_54 * 4)
                  );
        std::__cxx11::string::operator+=((string *)in_RDI,local_78);
        std::__cxx11::string::~string(local_78);
        local_30 = ",";
      }
    }
    StringPrintf_abi_cxx11_((char *)local_98," flag=%#x",(ulong)*(uint *)((long)local_10 + 0xc));
    std::__cxx11::string::operator+=((string *)in_RDI,local_98);
    std::__cxx11::string::~string(local_98);
  }
  return in_RDI;
}

Assistant:

std::string DFA::DumpState(State* state) {
  if (state == NULL)
    return "_";
  if (state == DeadState)
    return "X";
  if (state == FullMatchState)
    return "*";
  std::string s;
  const char* sep = "";
  s += StringPrintf("(%p)", state);
  for (int i = 0; i < state->ninst_; i++) {
    if (state->inst_[i] == Mark) {
      s += "|";
      sep = "";
    } else if (state->inst_[i] == MatchSep) {
      s += "||";
      sep = "";
    } else {
      s += StringPrintf("%s%d", sep, state->inst_[i]);
      sep = ",";
    }
  }
  s += StringPrintf(" flag=%#x", state->flag_);
  return s;
}